

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

bool __thiscall iDynTree::CubicSpline::computeCoefficients(CubicSpline *this)

{
  pointer pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double *pdVar7;
  size_t sVar8;
  size_type sVar9;
  reference pvVar10;
  vector<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_> *in_RDI;
  double dVar11;
  __type _Var12;
  size_t i;
  CubicSpline *in_stack_000005a0;
  int in_stack_ffffffffffffff4c;
  double __x;
  CubicSpline *in_stack_ffffffffffffff68;
  ulong local_18;
  bool local_1;
  
  if (((ulong)in_RDI[7].
              super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    pVVar1 = in_RDI[6].
             super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 1),0);
    *pdVar7 = (double)pVVar1;
    pVVar1 = in_RDI[6].
             super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar8 = VectorDynSize::size((VectorDynSize *)(in_RDI + 1));
    pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 1),sVar8 - 1);
    *pdVar7 = (double)pVVar1;
    bVar6 = computePhasesDuration(in_stack_ffffffffffffff68);
    if (bVar6) {
      sVar8 = VectorDynSize::size((VectorDynSize *)(in_RDI + 1));
      if ((sVar8 < 3) || (bVar6 = computeIntermediateVelocities(in_stack_000005a0), bVar6)) {
        for (local_18 = 0;
            sVar9 = std::
                    vector<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                    ::size(in_RDI), local_18 < sVar9; local_18 = local_18 + 1) {
          pdVar7 = VectorDynSize::operator()
                             ((VectorDynSize *)
                              &in_RDI[3].
                               super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18);
          __x = *pdVar7;
          pvVar10 = std::
                    vector<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                    ::operator[](in_RDI,local_18);
          pdVar7 = VectorFixSize<4U>::operator()(pvVar10,0);
          *pdVar7 = __x;
          pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 1),local_18);
          dVar2 = *pdVar7;
          pvVar10 = std::
                    vector<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                    ::operator[](in_RDI,local_18);
          pdVar7 = VectorFixSize<4U>::operator()(pvVar10,1);
          *pdVar7 = dVar2;
          pdVar7 = VectorDynSize::operator()
                             ((VectorDynSize *)
                              &in_RDI[3].
                               super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18 + 1);
          dVar2 = *pdVar7;
          pdVar7 = VectorDynSize::operator()
                             ((VectorDynSize *)
                              &in_RDI[3].
                               super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18);
          dVar11 = (dVar2 - *pdVar7) * 3.0;
          pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 5),local_18);
          dVar2 = *pdVar7;
          pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 1),local_18);
          dVar3 = *pdVar7;
          pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 1),local_18 + 1);
          dVar4 = *pdVar7;
          pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 5),local_18);
          dVar5 = *pdVar7;
          pvVar10 = std::
                    vector<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                    ::operator[](in_RDI,local_18);
          pdVar7 = VectorFixSize<4U>::operator()(pvVar10,2);
          *pdVar7 = ((dVar11 / dVar2 - (dVar3 + dVar3)) - dVar4) / dVar5;
          pdVar7 = VectorDynSize::operator()
                             ((VectorDynSize *)
                              &in_RDI[3].
                               super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18);
          dVar2 = *pdVar7;
          pdVar7 = VectorDynSize::operator()
                             ((VectorDynSize *)
                              &in_RDI[3].
                               super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_18 + 1);
          dVar3 = *pdVar7;
          pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 5),local_18);
          dVar4 = *pdVar7;
          pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 1),local_18);
          dVar5 = *pdVar7;
          pdVar7 = VectorDynSize::operator()((VectorDynSize *)(in_RDI + 1),local_18 + 1);
          dVar11 = *pdVar7;
          VectorDynSize::operator()((VectorDynSize *)(in_RDI + 5),local_18);
          _Var12 = std::pow<double,int>(__x,in_stack_ffffffffffffff4c);
          pvVar10 = std::
                    vector<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
                    ::operator[](in_RDI,local_18);
          pdVar7 = VectorFixSize<4U>::operator()(pvVar10,3);
          *pdVar7 = (((dVar2 - dVar3) * 2.0) / dVar4 + dVar5 + dVar11) / _Var12;
        }
        *(undefined1 *)
         &in_RDI[7].
          super__Vector_base<iDynTree::VectorFixSize<4U>,_std::allocator<iDynTree::VectorFixSize<4U>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool iDynTree::CubicSpline::computeCoefficients()
{
    // the coefficients are updated. No need to recompute them
    if(m_areCoefficientsUpdated){
        return true;
    }

    m_velocities(0) = m_v0;
    m_velocities(m_velocities.size() - 1) = m_vf;

    if(!this->computePhasesDuration())
        return false;

    if(m_velocities.size() > 2){
        if(!this->computeIntermediateVelocities())
            return false;
    }

    for(size_t i = 0; i < m_coefficients.size(); ++i){
        m_coefficients[i](0) = m_y(i);
        m_coefficients[i](1) = m_velocities(i);
        m_coefficients[i](2) = ( 3*(m_y(i+1) - m_y(i))/m_T(i) - 2*m_velocities(i) - m_velocities(i+1) )/m_T(i);
        m_coefficients[i](3) = ( 2*(m_y(i) - m_y(i+1))/m_T(i) + m_velocities(i) + m_velocities(i+1) )/std::pow(m_T(i), 2);
    }

    // The coefficients are now updated.
    m_areCoefficientsUpdated = true;

    return true;
}